

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::UnitTest::PushGTestTrace(UnitTest *this,TraceInfo *trace)

{
  vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> *this_00;
  GTestMutexLock local_20;
  MutexLock lock;
  TraceInfo *trace_local;
  UnitTest *this_local;
  
  lock.mutex_ = (MutexBase *)trace;
  internal::GTestMutexLock::GTestMutexLock(&local_20,&(this->mutex_).super_MutexBase);
  this_00 = internal::UnitTestImpl::gtest_trace_stack(this->impl_);
  std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>::
  push_back(this_00,(value_type *)lock.mutex_);
  internal::GTestMutexLock::~GTestMutexLock(&local_20);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  impl_->gtest_trace_stack().push_back(trace);
}